

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netgroup.cpp
# Opt level: O3

void __thiscall
NetGroupManager::ASMapHealthCheck
          (NetGroupManager *this,vector<CNetAddr,_std::allocator<CNetAddr>_> *clearnet_addrs)

{
  pointer pCVar1;
  string_view source_file;
  bool bVar2;
  uint32_t uVar3;
  Logger *pLVar4;
  pointer address;
  int *in_R9;
  CNetAddr *addr;
  pointer pCVar5;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  int unmapped_count;
  uint32_t asn;
  size_t local_120;
  long local_118;
  int local_110 [2];
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_108 [3];
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_108[0]._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_108[0]._M_impl.super__Rb_tree_header._M_header;
  local_108[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_108[0]._M_impl._0_8_ = 0;
  local_108[0]._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_108[0]._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_108[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_110[0] = 0;
  address = (clearnet_addrs->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pCVar1 = (clearnet_addrs->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pCVar5 = address;
  local_108[0]._M_impl.super__Rb_tree_header._M_header._M_right =
       local_108[0]._M_impl.super__Rb_tree_header._M_header._M_left;
  if (address != pCVar1) {
    do {
      uVar3 = GetMappedAS(this,address);
      local_58._M_dataplus._M_p._0_4_ = uVar3;
      if (uVar3 == 0) {
        local_110[0] = local_110[0] + 1;
      }
      else {
        std::
        _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
        ::_M_insert_unique<unsigned_int_const&>
                  ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    *)local_108,(uint *)&local_58);
      }
      address = address + 1;
    } while (address != pCVar1);
    address = (clearnet_addrs->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    pCVar5 = (clearnet_addrs->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  local_118 = (long)address - (long)pCVar5 >> 5;
  local_120 = local_108[0]._M_impl.super__Rb_tree_header._M_node_count;
  pLVar4 = LogInstance();
  bVar2 = BCLog::Logger::Enabled(pLVar4);
  if (bVar2) {
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    tinyformat::format<unsigned_long,unsigned_long,int>
              (&local_78,
               (tinyformat *)
               "ASMap Health Check: %i clearnet peers are mapped to %i ASNs with %i peers being unmapped\n"
               ,(char *)&local_118,&local_120,(unsigned_long *)local_110,in_R9);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_58,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    pLVar4 = LogInstance();
    local_78._M_dataplus._M_p = (pointer)0x55;
    local_78._M_string_length = 0xfa63d0;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netgroup.cpp";
    source_file._M_len = 0x55;
    str._M_str = local_58._M_dataplus._M_p;
    str._M_len = local_58._M_string_length;
    logging_function._M_str = "ASMapHealthCheck";
    logging_function._M_len = 0x10;
    BCLog::Logger::LogPrintStr(pLVar4,str,logging_function,source_file,0x7f,ALL,Info);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void NetGroupManager::ASMapHealthCheck(const std::vector<CNetAddr>& clearnet_addrs) const {
    std::set<uint32_t> clearnet_asns{};
    int unmapped_count{0};

    for (const auto& addr : clearnet_addrs) {
        uint32_t asn = GetMappedAS(addr);
        if (asn == 0) {
            ++unmapped_count;
            continue;
        }
        clearnet_asns.insert(asn);
    }

    LogPrintf("ASMap Health Check: %i clearnet peers are mapped to %i ASNs with %i peers being unmapped\n", clearnet_addrs.size(), clearnet_asns.size(), unmapped_count);
}